

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall GameBoard::draw(GameBoard *this)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  pointer piVar2;
  vector<int,_std::allocator<int>_> *__x;
  pointer piVar3;
  vector<int,_std::allocator<int>_> row;
  string print_buffor;
  
  clear();
  cbreak();
  noecho();
  nodelay(_stdscr,1);
  scrollok(_stdscr,0);
  print_buffor._M_dataplus._M_p = (pointer)&print_buffor.field_2;
  print_buffor._M_string_length = 0;
  print_buffor.field_2._M_local_buf[0] = '\0';
  pvVar1 = (this->board_matrix).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__x = (this->board_matrix).
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start; __x != pvVar1; __x = __x + 1) {
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)
               &row.super__Vector_base<int,_std::allocator<int>_>,__x);
    piVar2 = row.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish;
    for (piVar3 = row.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start; piVar3 != piVar2; piVar3 = piVar3 + 1) {
      std::__cxx11::string::assign((char *)&print_buffor);
      printw(print_buffor._M_dataplus._M_p);
      printw(" ");
      refresh();
    }
    printw("\n");
    refresh();
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&row.super__Vector_base<int,_std::allocator<int>_>);
  }
  std::__cxx11::string::~string((string *)&print_buffor);
  return;
}

Assistant:

void GameBoard::draw() {
    clear();
    cbreak();
    noecho();
    nodelay(stdscr, true);
    scrollok(stdscr, false);
    string print_buffor;
    for (vector<int> row: this->board_matrix) {
        for (int cell: row) {
            switch (cell) {
                case 5:
                    print_buffor = "#";
                    break;
                case 1:
                    print_buffor = "X";
                    break;
                case 4:
                    print_buffor = "@";
                    break;
                default: print_buffor = " ";
            }
//            cout << print_buffor << " ";
            printw(print_buffor.c_str());
            printw(" ");

            refresh();
        }
//        cout << endl;
//        char newline = '\n';
        printw("\n");
        refresh();
    }
//    cout << "\n\nsnake position: \nx: " << this->snakes[0]->head_y << " y:"<< this->snakes[0]->head_x;
//    cout << "\nilosc graczy: " << this->snakes.size() << endl;
}